

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> * __thiscall
rangeless::fn::impl::concat::operator()
          (vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           *__return_storage_ptr__,concat *this,
          vector<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
          *src)

{
  bool bVar1;
  iterator iVar2;
  move_iterator<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
  __last;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  local_58;
  const_iterator local_50;
  reference local_48;
  vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *v;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
  *__range3;
  vector<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
  *src_local;
  concat *this_local;
  vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *ret;
  
  memset(__return_storage_ptr__,0,0x18);
  std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::vector
            (__return_storage_ptr__);
  std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::clear
            (__return_storage_ptr__);
  __end0 = std::
           vector<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
           ::begin(src);
  v = (vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *)
      std::
      vector<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
      ::end(src);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_*,_std::vector<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
                                     *)&v), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_*,_std::vector<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
               ::operator*(&__end0);
    local_58._M_current =
         (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::end
                        (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
    ::__normal_iterator<rangeless::fn::impl::X*>
              ((__normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
                *)&local_50,&local_58);
    iVar2 = std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::begin
                      (local_48);
    __first = std::
              make_move_iterator<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>>
                        ((__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                          )iVar2._M_current);
    iVar2 = std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::end
                      (local_48);
    __last = std::
             make_move_iterator<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>>
                       ((__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                         )iVar2._M_current);
    std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>>,void>
              ((vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>> *)
               __return_storage_ptr__,local_50,__first,__last);
    __gnu_cxx::
    __normal_iterator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_*,_std::vector<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

Ret operator()(Iterable src) const
        {
            // TODO: return a vector instead? What if cont is a set or a map?

            Ret ret{};
            ret.clear(); // [compilation-error-hint]: Expecting Iterable::value_type to be a container.

            for(auto&& v : src) {
                ret.insert(ret.end(),
                           std::make_move_iterator(v.begin()),
                           std::make_move_iterator(v.end()));
            }

            return ret;
        }